

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void helper_sysret_x86_64(CPUX86State *env,int dflag)

{
  byte *pbVar1;
  int exception_index;
  ulong uVar2;
  uint uVar3;
  uintptr_t unaff_retaddr;
  
  if ((env->efer & 1) == 0) {
    exception_index = 6;
LAB_004d5c4c:
    raise_exception_err_ra_x86_64(env,exception_index,0,unaff_retaddr);
  }
  if (((env->cr[0] & 1) == 0) || ((env->hflags & 3) != 0)) {
    exception_index = 0xd;
    goto LAB_004d5c4c;
  }
  uVar3 = (uint)*(ushort *)((long)&env->star + 6);
  if ((env->hflags >> 0xe & 1) == 0) {
    pbVar1 = (byte *)((long)&env->eflags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  else {
    cpu_load_eflags(env,(int)env->regs[0xb],0x277300);
    if (dflag == 2) {
      cpu_x86_load_seg_cache(env,1,(uVar3 | 3) + 0x10,0,0xffffffff,0xa0fb00);
      uVar2 = env->regs[1];
      goto LAB_004d5c16;
    }
  }
  cpu_x86_load_seg_cache(env,1,uVar3 | 3,0,0xffffffff,0xc0fb00);
  uVar2 = (ulong)(uint)env->regs[1];
LAB_004d5c16:
  env->eip = uVar2;
  cpu_x86_load_seg_cache(env,2,(uVar3 | 3) + 8,0,0xffffffff,0xc0f300);
  return;
}

Assistant:

void helper_sysret(CPUX86State *env, int dflag)
{
    int cpl, selector;

    if (!(env->efer & MSR_EFER_SCE)) {
        raise_exception_err_ra(env, EXCP06_ILLOP, 0, GETPC());
    }
    cpl = env->hflags & HF_CPL_MASK;
    if (!(env->cr[0] & CR0_PE_MASK) || cpl != 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }
    selector = (env->star >> 48) & 0xffff;
    if (env->hflags & HF_LMA_MASK) {
        cpu_load_eflags(env, (uint32_t)(env->regs[11]), TF_MASK | AC_MASK
                        | ID_MASK | IF_MASK | IOPL_MASK | VM_MASK | RF_MASK |
                        NT_MASK);
        if (dflag == 2) {
            cpu_x86_load_seg_cache(env, R_CS, (selector + 16) | 3,
                                   0, 0xffffffff,
                                   DESC_G_MASK | DESC_P_MASK |
                                   DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                                   DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK |
                                   DESC_L_MASK);
            env->eip = env->regs[R_ECX];
        } else {
            cpu_x86_load_seg_cache(env, R_CS, selector | 3,
                                   0, 0xffffffff,
                                   DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                                   DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                                   DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK);
            env->eip = (uint32_t)env->regs[R_ECX];
        }
        cpu_x86_load_seg_cache(env, R_SS, (selector + 8) | 3,
                               0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    } else {
        env->eflags |= IF_MASK;
        cpu_x86_load_seg_cache(env, R_CS, selector | 3,
                               0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK);
        env->eip = (uint32_t)env->regs[R_ECX];
        cpu_x86_load_seg_cache(env, R_SS, (selector + 8) | 3,
                               0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    }
}